

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChTranscoder.cpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::XMLChTranscoder::transcodeFrom
          (XMLChTranscoder *this,XMLByte *srcData,XMLSize_t srcCount,XMLCh *toFill,
          XMLSize_t maxChars,XMLSize_t *bytesEaten,uchar *charSizes)

{
  size_t local_50;
  XMLSize_t countToDo;
  XMLSize_t srcChars;
  XMLSize_t *bytesEaten_local;
  XMLSize_t maxChars_local;
  XMLCh *toFill_local;
  XMLSize_t srcCount_local;
  XMLByte *srcData_local;
  XMLChTranscoder *this_local;
  
  local_50 = maxChars;
  if (srcCount >> 1 < maxChars) {
    local_50 = srcCount >> 1;
  }
  memcpy(toFill,srcData,local_50 << 1);
  *bytesEaten = local_50 << 1;
  memset(charSizes,2,local_50);
  return local_50;
}

Assistant:

XMLSize_t
XMLChTranscoder::transcodeFrom( const   XMLByte* const          srcData
                                , const XMLSize_t               srcCount
                                ,       XMLCh* const            toFill
                                , const XMLSize_t               maxChars
                                ,       XMLSize_t&              bytesEaten
                                ,       unsigned char* const    charSizes)
{
    //
    //  Calculate the max chars we can do here. Its the lesser of the
    //  max output chars and the number of chars in the source.
    //
    const XMLSize_t srcChars = srcCount / sizeof(XMLCh);
    const XMLSize_t countToDo = srcChars < maxChars ? srcChars : maxChars;

    //
    //  Copy over the count of chars that we precalculated. Notice we
    //  convert char count to byte count here!!!
    //
    memcpy(toFill, srcData, countToDo * sizeof(XMLCh));

    // Set the bytes eaten
    bytesEaten = countToDo * sizeof(XMLCh);

    // Set the character sizes to the fixed size
    memset(charSizes, static_cast<int>(sizeof(XMLCh)), countToDo);

    // Return the chars we transcoded
    return countToDo;
}